

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_dynamic_state<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info,ScratchAllocator *alloc,
          DynamicStateInfo *param_3)

{
  VkPipelineDynamicStateCreateInfo *pVVar1;
  VkDynamicState *pVVar2;
  void *pvVar3;
  uint32_t uVar4;
  VkStructureType VVar5;
  undefined4 uVar6;
  VkPipelineDynamicStateCreateInfo *pVVar7;
  VkDynamicState *__dest;
  size_t size;
  string local_48;
  
  pVVar1 = info->pDynamicState;
  if (pVVar1 == (VkPipelineDynamicStateCreateInfo *)0x0) {
    return true;
  }
  if (pVVar1->pNext != (void *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"pNext in VkPipelineDynamicStateCreateInfo not supported.","");
    log_error_pnext_chain(&local_48,info->pDynamicState->pNext);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  pVVar7 = (VkPipelineDynamicStateCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (pVVar7 == (VkPipelineDynamicStateCreateInfo *)0x0) {
    info->pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
    return true;
  }
  VVar5 = pVVar1->sType;
  uVar6 = *(undefined4 *)&pVVar1->field_0x4;
  pvVar3 = pVVar1->pNext;
  uVar4 = pVVar1->dynamicStateCount;
  pVVar2 = pVVar1->pDynamicStates;
  pVVar7->flags = pVVar1->flags;
  pVVar7->dynamicStateCount = uVar4;
  pVVar7->pDynamicStates = pVVar2;
  pVVar7->sType = VVar5;
  *(undefined4 *)&pVVar7->field_0x4 = uVar6;
  pVVar7->pNext = pvVar3;
  info->pDynamicState = pVVar7;
  if ((ulong)pVVar7->dynamicStateCount != 0) {
    pVVar2 = pVVar7->pDynamicStates;
    size = (ulong)pVVar7->dynamicStateCount << 2;
    __dest = (VkDynamicState *)ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (VkDynamicState *)0x0) {
      memmove(__dest,pVVar2,size);
      goto LAB_00134826;
    }
  }
  __dest = (VkDynamicState *)0x0;
LAB_00134826:
  info->pDynamicState->pDynamicStates = __dest;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_dynamic_state(CreateInfo *info, ScratchAllocator &alloc,
                                             const DynamicStateInfo *)
{
	if (info->pDynamicState)
	{
		if (info->pDynamicState->pNext)
		{
			log_error_pnext_chain("pNext in VkPipelineDynamicStateCreateInfo not supported.",
								  info->pDynamicState->pNext);
			return false;
		}
		info->pDynamicState = copy(info->pDynamicState, 1, alloc);
	}

	if (info->pDynamicState)
	{
		const_cast<VkPipelineDynamicStateCreateInfo *>(info->pDynamicState)->pDynamicStates =
				copy(info->pDynamicState->pDynamicStates, info->pDynamicState->dynamicStateCount, alloc);
	}

	return true;
}